

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Mem * out2Prerelease(Vdbe *p,VdbeOp *pOp)

{
  Mem *pOut;
  VdbeOp *pOp_local;
  Vdbe *p_local;
  
  p_local = (Vdbe *)(p->aMem + pOp->p2);
  if (((ulong)p_local->pPrev & 0x2400) == 0) {
    *(u16 *)&p_local->pPrev = 4;
  }
  else {
    p_local = (Vdbe *)out2PrereleaseWithClear((Mem *)p_local);
  }
  return (Mem *)p_local;
}

Assistant:

static Mem *out2Prerelease(Vdbe *p, VdbeOp *pOp){
  Mem *pOut;
  assert( pOp->p2>0 );
  assert( pOp->p2<=(p->nMem+1 - p->nCursor) );
  pOut = &p->aMem[pOp->p2];
  memAboutToChange(p, pOut);
  if( VdbeMemDynamic(pOut) ){ /*OPTIMIZATION-IF-FALSE*/
    return out2PrereleaseWithClear(pOut);
  }else{
    pOut->flags = MEM_Int;
    return pOut;
  }
}